

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.h
# Opt level: O0

void __thiscall
nodecpp::iibmalloc::
BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>::
deallocate(BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>
           *this,void *ptr)

{
  FreeChunkHeader *pFVar1;
  bool bVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  AnyChunkHeader *pAVar5;
  AnyChunkHeader *pAVar6;
  size_t deallocSize;
  uint16_t idx;
  FreeChunkHeader *hfree;
  FreeChunkHeader **local_80;
  anon_class_16_2_fcfb7c20 local_78;
  anon_class_8_1_898f37f1 local_68;
  FreeChunkHeader *local_60;
  AnyChunkHeader *next;
  AnyChunkHeader **local_50;
  anon_class_16_2_fd1d4ce0 local_48;
  anon_class_8_1_89904f31 local_38;
  FreeChunkHeader *local_30;
  AnyChunkHeader *prev;
  FreeChunkHeader *local_20;
  AnyChunkHeader *h;
  void *ptr_local;
  BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>
  *this_local;
  
  local_20 = (FreeChunkHeader *)ptr;
  h = (AnyChunkHeader *)ptr;
  ptr_local = this;
  uVar3 = AnyChunkHeader::getPageCount((AnyChunkHeader *)ptr);
  if (uVar3 == 0) {
    pAVar5 = AnyChunkHeader::prevInBlock(&local_20->super_AnyChunkHeader);
    PageAllocatorWithCaching::freeChunkNoCache
              (&this->super_PageAllocatorWithCaching,h,(size_t)pAVar5);
  }
  else {
    prev = (AnyChunkHeader *)&stack0xffffffffffffffe0;
    assert::
    nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_1_>
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
               ,0x2c2,(anon_class_8_1_54a39808 *)&prev,"h->getPageCount() <= max_pages");
    local_30 = (FreeChunkHeader *)AnyChunkHeader::prevInBlock(&local_20->super_AnyChunkHeader);
    if ((local_30 != (FreeChunkHeader *)0x0) &&
       (bVar2 = AnyChunkHeader::isFree((AnyChunkHeader *)local_30), bVar2)) {
      local_38.prev = (AnyChunkHeader **)&stack0xffffffffffffffd0;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_2_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2cb,&local_38,"prev->prevInBlock() == nullptr || !prev->prevInBlock()->isFree()"
                );
      local_48.prev = (AnyChunkHeader **)&stack0xffffffffffffffd0;
      local_48.h = (AnyChunkHeader **)&stack0xffffffffffffffe0;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_3_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2cc,&local_48,"prev->nextInBlock() == h");
      next = (AnyChunkHeader *)&stack0xffffffffffffffd0;
      local_50 = (AnyChunkHeader **)&stack0xffffffffffffffe0;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_4_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2cd,(anon_class_16_2_fd1d4ce0 *)&next,
                 "reinterpret_cast<uint8_t*>(prev->prevInBlock()) + ((uintptr_t)(prev->prevInBlock()->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( h )"
                );
      removeFromFreeList(this,local_30);
      pFVar1 = local_30;
      pAVar5 = AnyChunkHeader::prevInBlock(&local_30->super_AnyChunkHeader);
      pAVar6 = AnyChunkHeader::nextInBlock(&local_20->super_AnyChunkHeader);
      uVar3 = AnyChunkHeader::getPageCount(&local_30->super_AnyChunkHeader);
      uVar4 = AnyChunkHeader::getPageCount(&local_20->super_AnyChunkHeader);
      AnyChunkHeader::set(&pFVar1->super_AnyChunkHeader,pAVar5,pAVar6,uVar3 + uVar4,true);
      local_20 = local_30;
    }
    local_60 = (FreeChunkHeader *)AnyChunkHeader::nextInBlock(&local_20->super_AnyChunkHeader);
    if ((local_60 != (FreeChunkHeader *)0x0) &&
       (bVar2 = AnyChunkHeader::isFree((AnyChunkHeader *)local_60), bVar2)) {
      local_68.next = (AnyChunkHeader **)&local_60;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_5_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2d5,&local_68,"next->nextInBlock() == nullptr || !next->nextInBlock()->isFree()"
                );
      local_78.next = (AnyChunkHeader **)&local_60;
      local_78.h = (AnyChunkHeader **)&stack0xffffffffffffffe0;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_6_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2d6,&local_78,"next->prevInBlock() == h");
      hfree = (FreeChunkHeader *)&stack0xffffffffffffffe0;
      local_80 = &local_60;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_7_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2d7,(anon_class_16_2_d70565c2 *)&hfree,
                 "reinterpret_cast<uint8_t*>(h) + ((uintptr_t)(h->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( next )"
                );
      removeFromFreeList(this,local_60);
      pFVar1 = local_20;
      pAVar5 = AnyChunkHeader::prevInBlock(&local_20->super_AnyChunkHeader);
      pAVar6 = AnyChunkHeader::nextInBlock(&local_60->super_AnyChunkHeader);
      uVar3 = AnyChunkHeader::getPageCount(&local_20->super_AnyChunkHeader);
      uVar4 = AnyChunkHeader::getPageCount(&local_60->super_AnyChunkHeader);
      AnyChunkHeader::set(&pFVar1->super_AnyChunkHeader,pAVar5,pAVar6,uVar3 + uVar4,true);
    }
    pFVar1 = local_20;
    uVar3 = AnyChunkHeader::getPageCount(&local_20->super_AnyChunkHeader);
    deallocSize._6_2_ = uVar3 - 1;
    if (0x1f < deallocSize._6_2_) {
      deallocSize._6_2_ = 0x20;
    }
    pFVar1->prevFree = (FreeChunkHeader *)0x0;
    pFVar1->nextFree = this->freeListBegin[deallocSize._6_2_];
    if (this->freeListBegin[deallocSize._6_2_] != (FreeChunkHeader *)0x0) {
      this->freeListBegin[deallocSize._6_2_]->prevFree = pFVar1;
    }
    this->freeListBegin[deallocSize._6_2_] = pFVar1;
  }
  return;
}

Assistant:

void deallocate( void* ptr )
	{
		AnyChunkHeader* h = reinterpret_cast<AnyChunkHeader*>( ptr );
		if ( h->getPageCount() != 0 )
		{
			NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, h->getPageCount() <= max_pages );
#ifdef BULKALLOCATOR_HEAVY_DEBUG
		dbgValidateAllBlocks();
		dbgValidateAllFreeLists();
#endif

			AnyChunkHeader* prev = h->prevInBlock();
			if ( prev && prev->isFree() )
			{
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, prev->prevInBlock() == nullptr || !prev->prevInBlock()->isFree() );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, prev->nextInBlock() == h );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, reinterpret_cast<uint8_t*>(prev->prevInBlock()) + ((uintptr_t)(prev->prevInBlock()->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( h ) );
				removeFromFreeList( static_cast<FreeChunkHeader*>(prev) );
				prev->set( prev->prevInBlock(), h->nextInBlock(), prev->getPageCount() + h->getPageCount(), true );
				h = prev;
			}
			AnyChunkHeader* next = h->nextInBlock();
			if ( next && next->isFree() )
			{
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, next->nextInBlock() == nullptr || !next->nextInBlock()->isFree() );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, next->prevInBlock() == h );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, reinterpret_cast<uint8_t*>(h) + ((uintptr_t)(h->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( next ) );
				removeFromFreeList( static_cast<FreeChunkHeader*>(next) );
				h->set( h->prevInBlock(), next->nextInBlock(), h->getPageCount() + next->getPageCount(), true );
			}

			FreeChunkHeader* hfree = static_cast<FreeChunkHeader*>(h);
			uint16_t idx = hfree->getPageCount() - 1;
			if ( idx >= max_pages )
				idx = max_pages;
			hfree->prevFree = nullptr;
			hfree->nextFree = freeListBegin[idx];
			if ( freeListBegin[idx] != nullptr )
				freeListBegin[idx]->prevFree = hfree;
			freeListBegin[idx] = hfree;

#ifdef BULKALLOCATOR_HEAVY_DEBUG
		dbgValidateAllBlocks();
		dbgValidateAllFreeLists();
#endif
		}
		else
		{
			size_t deallocSize = (size_t)(h->prevInBlock());
			this->freeChunkNoCache( ptr, deallocSize );
		}

	}